

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

const_iterator
frozen::unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq>::
find_impl<frozen::unordered_map<frozen::basic_string<char>,int,3ul,frozen::elsa<void>,eq>const&,std::__cxx11::string,frozen::elsa<void>,eq>
          (unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *self,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,elsa<void> *hash,
          eq *equal)

{
  bool bVar1;
  size_t sVar2;
  const_iterator pvVar3;
  unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *puVar4;
  const_iterator it;
  size_t pos;
  eq *equal_local;
  elsa<void> *hash_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *self_local;
  
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<void>>::lookup<std::__cxx11::string,frozen::elsa<void>>
                    ((pmh_tables<8ul,frozen::elsa<void>> *)&self->tables_,key,hash);
  pvVar3 = bits::carray<std::pair<const_frozen::basic_string<char>,_int>,_3UL>::begin(&self->items_)
  ;
  self_local = (unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *)
               (pvVar3 + sVar2);
  puVar4 = (unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *)
           bits::carray<std::pair<const_frozen::basic_string<char>,_int>,_3UL>::end(&self->items_);
  if ((self_local == puVar4) || (bVar1 = eq::operator()(equal,(string *)self_local,key), !bVar1)) {
    self_local = (unordered_map<frozen::basic_string<char>,_int,_3UL,_frozen::elsa<void>,_eq> *)
                 bits::carray<std::pair<const_frozen::basic_string<char>,_int>,_3UL>::end
                           (&self->items_);
  }
  return (const_iterator)self_local;
}

Assistant:

static inline constexpr auto find_impl(This&& self, KeyType const &key, Hasher const &hash, Equal const &equal) {
    auto const pos = self.tables_.lookup(key, hash);
    auto it = self.items_.begin() + pos;
    if (it != self.items_.end() && equal(it->first, key))
      return it;
    else
      return self.items_.end();
  }